

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant.cpp
# Opt level: O0

UMatchDegree __thiscall
icu_63::Quantifier::matches
          (Quantifier *this,Replaceable *text,int32_t *offset,int32_t limit,UBool incremental)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  UMatchDegree m;
  int32_t pos;
  uint32_t count;
  int32_t start;
  UBool incremental_local;
  int32_t limit_local;
  int32_t *offset_local;
  Replaceable *text_local;
  Quantifier *this_local;
  
  iVar1 = *offset;
  m = U_MISMATCH;
  while (m < this->maxCount) {
    iVar2 = *offset;
    iVar3 = (*(this->matcher->super_UObject)._vptr_UObject[4])();
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
                      ((long *)CONCAT44(extraout_var,iVar3),text,offset,limit,(int)incremental);
    if (iVar3 != 2) {
      if ((incremental != '\0') && (iVar3 == 1)) {
        return U_PARTIAL_MATCH;
      }
      break;
    }
    m = m + U_PARTIAL_MATCH;
    if (iVar2 == *offset) break;
  }
  if ((incremental == '\0') || (*offset != limit)) {
    if (m < this->minCount) {
      *offset = iVar1;
      this_local._4_4_ = U_MISMATCH;
    }
    else {
      this_local._4_4_ = U_MATCH;
    }
  }
  else {
    this_local._4_4_ = U_PARTIAL_MATCH;
  }
  return this_local._4_4_;
}

Assistant:

UMatchDegree Quantifier::matches(const Replaceable& text,
                                 int32_t& offset,
                                 int32_t limit,
                                 UBool incremental) {
    int32_t start = offset;
    uint32_t count = 0;
    while (count < maxCount) {
        int32_t pos = offset;
        UMatchDegree m = matcher->toMatcher()->matches(text, offset, limit, incremental);
        if (m == U_MATCH) {
            ++count;
            if (pos == offset) {
                // If offset has not moved we have a zero-width match.
                // Don't keep matching it infinitely.
                break;
            }
        } else if (incremental && m == U_PARTIAL_MATCH) {
            return U_PARTIAL_MATCH;
        } else {
            break;
        }
    }
    if (incremental && offset == limit) {
        return U_PARTIAL_MATCH;
    }
    if (count >= minCount) {
        return U_MATCH;
    }
    offset = start;
    return U_MISMATCH;
}